

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall
httplib::Server::apply_ranges
          (Server *this,Request *req,Response *res,string *content_type,string *boundary)

{
  Headers *this_00;
  string *this_01;
  size_t length_00;
  pointer ppVar1;
  pointer ppVar2;
  detail *pdVar3;
  anon_class_16_2_20c26d81 content;
  char cVar4;
  uint uVar5;
  bool bVar6;
  EncodingType EVar7;
  iterator __position;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  ulong uVar10;
  char cVar11;
  detail *pdVar12;
  _Alloc_hider _Var13;
  string *content_length;
  ulong uVar14;
  size_t offset;
  pointer pcVar15;
  string length;
  string __str;
  _Alloc_hider in_stack_ffffffffffffff68;
  uint local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [3];
  
  content_length = boundary;
  local_68[1]._0_8_ = content_type;
  if (0x10 < (ulong)((long)(req->ranges).
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(req->ranges).
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    detail::make_multipart_data_boundary_abi_cxx11_();
    std::__cxx11::string::operator=((string *)boundary,(string *)&stack0xffffffffffffff68);
    if ((string *)in_stack_ffffffffffffff68._M_p != (string *)&stack0xffffffffffffff78) {
      operator_delete(in_stack_ffffffffffffff68._M_p,CONCAT71(uStack_87,local_88) + 1);
    }
    _Var9._M_p = (pointer)&stack0xffffffffffffff78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff68,"Content-Type","");
    this_00 = &res->headers;
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&this_00->_M_t,(key_type *)&stack0xffffffffffffff68);
    if ((string *)_Var9._M_p != (string *)&stack0xffffffffffffff78) {
      operator_delete(_Var9._M_p,CONCAT71(uStack_87,local_88) + 1);
    }
    if ((_Rb_tree_header *)__position._M_node != &(res->headers)._M_t._M_impl.super__Rb_tree_header)
    {
      std::__cxx11::string::_M_assign((string *)local_68[1]._0_8_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(const_iterator)__position._M_node);
    }
    in_stack_ffffffffffffff68._M_p = (pointer)&stack0xffffffffffffff78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff68,"Content-Type","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   "multipart/byteranges; boundary=",boundary);
    cVar11 = *in_stack_ffffffffffffff68._M_p;
    _Var9._M_p = in_stack_ffffffffffffff68._M_p;
    while (((cVar11 != '\0' &&
            (_Var9._M_p = (pointer)((long)&(((string *)_Var9._M_p)->_M_dataplus)._M_p + 1),
            cVar11 != '\n')) && (cVar11 != '\r'))) {
      cVar11 = *(char *)&(((string *)_Var9._M_p)->_M_dataplus)._M_p;
    }
    if (cVar11 == '\0') {
      cVar11 = *(char *)local_78._M_allocated_capacity;
      uVar8 = local_78._M_allocated_capacity;
      while (((cVar11 != '\0' && (uVar8 = uVar8 + 1, cVar11 != '\n')) && (cVar11 != '\r'))) {
        cVar11 = *(char *)uVar8;
      }
      if (cVar11 == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68[0]._M_allocated_capacity + 1);
    }
    if ((string *)in_stack_ffffffffffffff68._M_p != (string *)&stack0xffffffffffffff78) {
      operator_delete(in_stack_ffffffffffffff68._M_p,CONCAT71(uStack_87,local_88) + 1);
    }
  }
  EVar7 = detail::encoding_type(req,res);
  length_00 = (res->body)._M_string_length;
  if (length_00 == 0) {
    _Var9._M_p = (pointer)res->content_length_;
    if (_Var9._M_p == (pointer)0x0) {
      if ((res->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0) {
        return;
      }
      if (res->is_chunked_content_provider_ != true) {
        return;
      }
      _Var13._M_p = &stack0xffffffffffffff78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff68,"Transfer-Encoding","");
      local_78._M_allocated_capacity = (size_type)local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"chunked","");
      cVar11 = *_Var13._M_p;
      _Var9._M_p = _Var13._M_p;
      while (((cVar11 != '\0' && (_Var9._M_p = _Var9._M_p + 1, cVar11 != '\n')) && (cVar11 != '\r'))
            ) {
        cVar11 = *_Var9._M_p;
      }
      if (cVar11 == '\0') {
        cVar11 = *(char *)local_78._M_allocated_capacity;
        uVar8 = local_78._M_allocated_capacity;
        while (((cVar11 != '\0' && (uVar8 = uVar8 + 1, cVar11 != '\n')) && (cVar11 != '\r'))) {
          cVar11 = *(char *)uVar8;
        }
        if (cVar11 == '\0') {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&res->headers,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78)
          ;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_allocated_capacity != local_68) {
        operator_delete((void *)local_78._M_allocated_capacity,local_68[0]._M_allocated_capacity + 1
                       );
      }
      if (_Var13._M_p != &stack0xffffffffffffff78) {
        operator_delete(_Var13._M_p,CONCAT71(uStack_87,local_88) + 1);
      }
      _Var13._M_p = &stack0xffffffffffffff78;
      if (EVar7 == Brotli) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xffffffffffffff68,"Content-Encoding","");
        local_78._M_allocated_capacity = (size_type)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"br","");
        Response::set_header(res,(string *)&stack0xffffffffffffff68,(string *)&local_78);
      }
      else {
        if (EVar7 != Gzip) {
          return;
        }
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xffffffffffffff68,"Content-Encoding","");
        local_78._M_allocated_capacity = (size_type)local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"gzip","");
        Response::set_header(res,(string *)&stack0xffffffffffffff68,(string *)&local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_allocated_capacity != local_68) {
        operator_delete((void *)local_78._M_allocated_capacity,local_68[0]._M_allocated_capacity + 1
                       );
      }
      if (_Var13._M_p == &stack0xffffffffffffff78) {
        return;
      }
    }
    else {
      ppVar1 = (req->ranges).
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (req->ranges).
               super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (ppVar1 != ppVar2) {
        if ((long)ppVar2 - (long)ppVar1 == 0x10) {
          pdVar3 = (detail *)ppVar1->first;
          pcVar15 = (pointer)ppVar1->second;
          if (((ulong)pdVar3 & (ulong)pcVar15) == 0xffffffffffffffff) {
            pdVar12 = (detail *)0x0;
            pcVar15 = _Var9._M_p;
          }
          else {
            pdVar12 = (detail *)0x0;
            if (0 < (long)(_Var9._M_p + -(long)pcVar15)) {
              pdVar12 = (detail *)(_Var9._M_p + -(long)pcVar15);
            }
            if (pdVar3 != (detail *)0xffffffffffffffff) {
              pdVar12 = pdVar3;
            }
            if (pdVar3 == (detail *)0xffffffffffffffff) {
              pcVar15 = _Var9._M_p + -1;
            }
            if (pcVar15 == (pointer)0xffffffffffffffff) {
              pcVar15 = _Var9._M_p + -1;
            }
            pcVar15 = pcVar15 + (1 - (long)pdVar12);
          }
          detail::make_content_range_header_field_abi_cxx11_
                    ((string *)&stack0xffffffffffffff68,pdVar12,(size_t)pcVar15,(size_t)_Var9._M_p,
                     (size_t)content_length);
          local_78._M_allocated_capacity = (size_type)local_68;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Content-Range","");
          cVar11 = *(char *)local_78._M_allocated_capacity;
          uVar8 = local_78._M_allocated_capacity;
          while (((cVar11 != '\0' && (uVar8 = uVar8 + 1, cVar11 != '\n')) && (cVar11 != '\r'))) {
            cVar11 = *(char *)uVar8;
          }
          if (cVar11 == '\0') {
            cVar11 = *in_stack_ffffffffffffff68._M_p;
            _Var9._M_p = in_stack_ffffffffffffff68._M_p;
            while (((cVar11 != '\0' &&
                    (_Var9._M_p = (pointer)((long)&(((string *)_Var9._M_p)->_M_dataplus)._M_p + 1),
                    cVar11 != '\n')) && (cVar11 != '\r'))) {
              cVar11 = *(char *)&(((string *)_Var9._M_p)->_M_dataplus)._M_p;
            }
            if (cVar11 == '\0') {
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&res->headers,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff68);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_allocated_capacity != local_68) {
            operator_delete((void *)local_78._M_allocated_capacity,
                            local_68[0]._M_allocated_capacity + 1);
          }
          _Var9._M_p = pcVar15;
          if ((string *)in_stack_ffffffffffffff68._M_p != (string *)&stack0xffffffffffffff78) {
            operator_delete(in_stack_ffffffffffffff68._M_p,CONCAT71(uStack_87,local_88) + 1);
          }
        }
        else {
          _Var9._M_p = (pointer)0x0;
          detail::
          process_multipart_ranges_data<httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_2_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(unsigned_long,unsigned_long)_1_>
                    (req,res,boundary,(string *)local_68[1]._0_8_,
                     (anon_class_8_1_b58d1f7b)&stack0xffffffffffffff68,
                     (anon_class_8_1_b58d1f7b)&stack0xffffffffffffff68,
                     (anon_class_8_1_b58d1f7b)&stack0xffffffffffffff68);
        }
      }
      _Var13._M_p = &stack0xffffffffffffff78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff68,"Content-Length","");
      cVar11 = '\x01';
      if ((pointer)0x9 < _Var9._M_p) {
        pcVar15 = _Var9._M_p;
        cVar4 = '\x04';
        do {
          cVar11 = cVar4;
          if (pcVar15 < (pointer)0x64) {
            cVar11 = cVar11 + -2;
            goto LAB_00150f78;
          }
          if (pcVar15 < (pointer)0x3e8) {
            cVar11 = cVar11 + -1;
            goto LAB_00150f78;
          }
          if (pcVar15 < (pointer)0x2710) goto LAB_00150f78;
          bVar6 = (pointer)0x1869f < pcVar15;
          pcVar15 = (pointer)((ulong)pcVar15 / 10000);
          cVar4 = cVar11 + '\x04';
        } while (bVar6);
        cVar11 = cVar11 + '\x01';
      }
LAB_00150f78:
      local_78._M_allocated_capacity = (size_type)local_68;
      std::__cxx11::string::_M_construct((ulong)&local_78,cVar11);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_78._M_allocated_capacity,local_78._8_4_,(unsigned_long)_Var9._M_p);
      cVar11 = *_Var13._M_p;
      _Var9._M_p = _Var13._M_p;
      while (((cVar11 != '\0' && (_Var9._M_p = _Var9._M_p + 1, cVar11 != '\n')) && (cVar11 != '\r'))
            ) {
        cVar11 = *_Var9._M_p;
      }
      if (cVar11 == '\0') {
        cVar11 = *(char *)local_78._M_allocated_capacity;
        uVar8 = local_78._M_allocated_capacity;
        while (((cVar11 != '\0' && (uVar8 = uVar8 + 1, cVar11 != '\n')) && (cVar11 != '\r'))) {
          cVar11 = *(char *)uVar8;
        }
        if (cVar11 == '\0') {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&res->headers,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78)
          ;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_allocated_capacity != local_68) {
        operator_delete((void *)local_78._M_allocated_capacity,local_68[0]._M_allocated_capacity + 1
                       );
      }
      if (_Var13._M_p == &stack0xffffffffffffff78) {
        return;
      }
    }
    goto LAB_00150db0;
  }
  ppVar1 = (req->ranges).
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (req->ranges).
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    this_01 = &res->body;
    if ((long)ppVar2 - (long)ppVar1 == 0x10) {
      pdVar3 = (detail *)ppVar1->first;
      uVar14 = ppVar1->second;
      if (((ulong)pdVar3 & uVar14) == 0xffffffffffffffff) {
        pdVar12 = (detail *)0x0;
        offset = length_00;
      }
      else {
        pdVar12 = (detail *)0x0;
        if (0 < (long)(length_00 - uVar14)) {
          pdVar12 = (detail *)(length_00 - uVar14);
        }
        if (pdVar3 != (detail *)0xffffffffffffffff) {
          pdVar12 = pdVar3;
        }
        if (pdVar3 == (detail *)0xffffffffffffffff) {
          uVar14 = length_00 - 1;
        }
        if (uVar14 == 0xffffffffffffffff) {
          uVar14 = length_00 - 1;
        }
        offset = (uVar14 - (long)pdVar12) + 1;
      }
      detail::make_content_range_header_field_abi_cxx11_
                ((string *)&stack0xffffffffffffff68,pdVar12,offset,length_00,(size_t)content_length)
      ;
      local_78._M_allocated_capacity = (size_type)local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Content-Range","");
      cVar11 = *(char *)local_78._M_allocated_capacity;
      uVar8 = local_78._M_allocated_capacity;
      while (((cVar11 != '\0' && (uVar8 = uVar8 + 1, cVar11 != '\n')) && (cVar11 != '\r'))) {
        cVar11 = *(char *)uVar8;
      }
      if (cVar11 == '\0') {
        cVar11 = *in_stack_ffffffffffffff68._M_p;
        _Var9._M_p = in_stack_ffffffffffffff68._M_p;
        while (((cVar11 != '\0' &&
                (_Var9._M_p = (pointer)((long)&(((string *)_Var9._M_p)->_M_dataplus)._M_p + 1),
                cVar11 != '\n')) && (cVar11 != '\r'))) {
          cVar11 = *(char *)&(((string *)_Var9._M_p)->_M_dataplus)._M_p;
        }
        if (cVar11 == '\0') {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&res->headers,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff68);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_allocated_capacity != local_68) {
        operator_delete((void *)local_78._M_allocated_capacity,local_68[0]._M_allocated_capacity + 1
                       );
      }
      if (pdVar12 < (detail *)(res->body)._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_78,(ulong)this_01);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_allocated_capacity != local_68) {
          operator_delete((void *)local_78._M_allocated_capacity,
                          local_68[0]._M_allocated_capacity + 1);
        }
      }
      else {
        (res->body)._M_string_length = 0;
        *(res->body)._M_dataplus._M_p = '\0';
        res->status = 0x1a0;
      }
      uVar5 = local_90;
      if ((string *)in_stack_ffffffffffffff68._M_p != (string *)&stack0xffffffffffffff78) {
LAB_00150c24:
        local_90 = uVar5;
        operator_delete(in_stack_ffffffffffffff68._M_p,CONCAT71(uStack_87,local_88) + 1);
      }
    }
    else {
      local_90 = 0;
      local_88 = '\0';
      local_78._8_8_ = &stack0xffffffffffffff68;
      content.data = (string *)&stack0xffffffffffffff78;
      content.res = (Response *)local_78._8_8_;
      in_stack_ffffffffffffff68._M_p = (pointer)&stack0xffffffffffffff78;
      local_78._M_allocated_capacity = (size_type)res;
      bVar6 = detail::
              process_multipart_ranges_data<httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&)::_lambda(std::__cxx11::string_const&)_2_,httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&)::_lambda(unsigned_long,unsigned_long)_1_>
                        ((detail *)req,(Request *)res,(Response *)boundary,
                         (string *)local_68[1]._0_8_,(string *)local_78._8_8_,
                         (anon_class_8_1_898a9ca8)local_78._8_8_,(anon_class_8_1_898a9ca8)res,
                         content);
      if (bVar6) {
        std::__cxx11::string::swap((string *)this_01);
      }
      else {
        (res->body)._M_string_length = 0;
        *(res->body)._M_dataplus._M_p = '\0';
        res->status = 0x1a0;
      }
      uVar5 = 0;
      if ((string *)in_stack_ffffffffffffff68._M_p != (string *)&stack0xffffffffffffff78)
      goto LAB_00150c24;
    }
  }
  uVar14 = (res->body)._M_string_length;
  cVar11 = '\x01';
  if (9 < uVar14) {
    uVar10 = uVar14;
    cVar4 = '\x04';
    do {
      cVar11 = cVar4;
      if (uVar10 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_00150cd0;
      }
      if (uVar10 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_00150cd0;
      }
      if (uVar10 < 10000) goto LAB_00150cd0;
      bVar6 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar4 = cVar11 + '\x04';
    } while (bVar6);
    cVar11 = cVar11 + '\x01';
  }
LAB_00150cd0:
  _Var13._M_p = &stack0xffffffffffffff78;
  std::__cxx11::string::_M_construct((ulong)&stack0xffffffffffffff68,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>(_Var13._M_p,local_90,uVar14);
  local_78._M_allocated_capacity = (size_type)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Content-Length","");
  cVar11 = *(char *)local_78._M_allocated_capacity;
  uVar8 = local_78._M_allocated_capacity;
  while (((cVar11 != '\0' && (uVar8 = uVar8 + 1, cVar11 != '\n')) && (cVar11 != '\r'))) {
    cVar11 = *(char *)uVar8;
  }
  if (cVar11 == '\0') {
    cVar11 = *_Var13._M_p;
    _Var9._M_p = _Var13._M_p;
    while (((cVar11 != '\0' && (_Var9._M_p = _Var9._M_p + 1, cVar11 != '\n')) && (cVar11 != '\r')))
    {
      cVar11 = *_Var9._M_p;
    }
    if (cVar11 == '\0') {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&res->headers,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff68);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68[0]._M_allocated_capacity + 1);
  }
  if (_Var13._M_p == &stack0xffffffffffffff78) {
    return;
  }
LAB_00150db0:
  operator_delete(_Var13._M_p,CONCAT71(uStack_87,local_88) + 1);
  return;
}

Assistant:

inline void Server::apply_ranges(const Request &req, Response &res,
                                 std::string &content_type,
                                 std::string &boundary) {
  if (req.ranges.size() > 1) {
    boundary = detail::make_multipart_data_boundary();

    auto it = res.headers.find("Content-Type");
    if (it != res.headers.end()) {
      content_type = it->second;
      res.headers.erase(it);
    }

    res.set_header("Content-Type",
                   "multipart/byteranges; boundary=" + boundary);
  }

  auto type = detail::encoding_type(req, res);

  if (res.body.empty()) {
    if (res.content_length_ > 0) {
      size_t length = 0;
      if (req.ranges.empty()) {
        length = res.content_length_;
      } else if (req.ranges.size() == 1) {
        auto offsets =
            detail::get_range_offset_and_length(req, res.content_length_, 0);
        auto offset = offsets.first;
        length = offsets.second;
        auto content_range = detail::make_content_range_header_field(
            offset, length, res.content_length_);
        res.set_header("Content-Range", content_range);
      } else {
        length = detail::get_multipart_ranges_data_length(req, res, boundary,
                                                          content_type);
      }
      res.set_header("Content-Length", std::to_string(length));
    } else {
      if (res.content_provider_) {
        if (res.is_chunked_content_provider_) {
          res.set_header("Transfer-Encoding", "chunked");
          if (type == detail::EncodingType::Gzip) {
            res.set_header("Content-Encoding", "gzip");
          } else if (type == detail::EncodingType::Brotli) {
            res.set_header("Content-Encoding", "br");
          }
        }
      }
    }
  } else {
    if (req.ranges.empty()) {
      ;
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.body.size(), 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      auto content_range = detail::make_content_range_header_field(
          offset, length, res.body.size());
      res.set_header("Content-Range", content_range);
      if (offset < res.body.size()) {
        res.body = res.body.substr(offset, length);
      } else {
        res.body.clear();
        res.status = 416;
      }
    } else {
      std::string data;
      if (detail::make_multipart_ranges_data(req, res, boundary, content_type,
                                             data)) {
        res.body.swap(data);
      } else {
        res.body.clear();
        res.status = 416;
      }
    }

    if (type != detail::EncodingType::None) {
      std::unique_ptr<detail::compressor> compressor;
      std::string content_encoding;

      if (type == detail::EncodingType::Gzip) {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        compressor = detail::make_unique<detail::gzip_compressor>();
        content_encoding = "gzip";
#endif
      } else if (type == detail::EncodingType::Brotli) {
#ifdef CPPHTTPLIB_BROTLI_SUPPORT
        compressor = detail::make_unique<detail::brotli_compressor>();
        content_encoding = "br";
#endif
      }

      if (compressor) {
        std::string compressed;
        if (compressor->compress(res.body.data(), res.body.size(), true,
                                 [&](const char *data, size_t data_len) {
                                   compressed.append(data, data_len);
                                   return true;
                                 })) {
          res.body.swap(compressed);
          res.set_header("Content-Encoding", content_encoding);
        }
      }
    }

    auto length = std::to_string(res.body.size());
    res.set_header("Content-Length", length);
  }
}